

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_stats.cpp
# Opt level: O2

BaseStatistics *
duckdb::StructStats::CreateUnknown(BaseStatistics *__return_storage_ptr__,LogicalType *type)

{
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var1;
  child_list_t<LogicalType> *this;
  const_reference pvVar2;
  long lVar3;
  ulong __n;
  LogicalType local_b8;
  LogicalType local_a0;
  BaseStatistics local_88;
  
  this = StructType::GetChildTypes_abi_cxx11_(type);
  LogicalType::LogicalType(&local_b8,type);
  BaseStatistics::BaseStatistics(__return_storage_ptr__,&local_b8);
  LogicalType::~LogicalType(&local_b8);
  __return_storage_ptr__->has_null = true;
  __return_storage_ptr__->has_no_null = true;
  lVar3 = 0;
  for (__n = 0; __n < (ulong)(((long)(this->
                                     super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ).
                                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->
                                    super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ).
                                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) / 0x38);
      __n = __n + 1) {
    _Var1._M_head_impl =
         (__return_storage_ptr__->child_stats).
         super_unique_ptr<duckdb::BaseStatistics[],_std::default_delete<duckdb::BaseStatistics[]>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics[]>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    pvVar2 = vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
             ::get<true>(this,__n);
    LogicalType::LogicalType(&local_a0,&pvVar2->second);
    BaseStatistics::CreateUnknown(&local_88,&local_a0);
    BaseStatistics::Copy((BaseStatistics *)((long)&(_Var1._M_head_impl)->type + lVar3),&local_88);
    BaseStatistics::~BaseStatistics(&local_88);
    LogicalType::~LogicalType(&local_a0);
    lVar3 = lVar3 + 0x58;
  }
  return __return_storage_ptr__;
}

Assistant:

BaseStatistics StructStats::CreateUnknown(LogicalType type) {
	auto &child_types = StructType::GetChildTypes(type);
	BaseStatistics result(std::move(type));
	result.InitializeUnknown();
	for (idx_t i = 0; i < child_types.size(); i++) {
		result.child_stats[i].Copy(BaseStatistics::CreateUnknown(child_types[i].second));
	}
	return result;
}